

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O0

ion_err_t lfb_update(ion_lfb_t *bag,ion_file_offset_t offset,uint num_bytes,ion_byte_t *to_write,
                    ion_file_offset_t *next)

{
  ion_err_t error;
  ion_file_offset_t *next_local;
  ion_byte_t *to_write_local;
  uint num_bytes_local;
  ion_file_offset_t offset_local;
  ion_lfb_t *bag_local;
  
  if ((next == (ion_file_offset_t *)0x0) ||
     (bag_local._7_1_ = lfb_update_next(bag,offset,*next), bag_local._7_1_ == '\0')) {
    bag_local._7_1_ = ion_fwrite_at(bag->file_handle,offset + 8,num_bytes,to_write);
  }
  return bag_local._7_1_;
}

Assistant:

ion_err_t
lfb_update(
	ion_lfb_t			*bag,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*to_write,
	ion_file_offset_t	*next
) {
	ion_err_t error;

	if (NULL != next) {
		error = lfb_update_next(bag, offset, *next);

		if (err_ok != error) {
			return error;
		}
	}

	error = ion_fwrite_at(bag->file_handle, offset + sizeof(ion_file_offset_t), num_bytes, to_write);

	return error;
}